

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

WirehairResult __thiscall wirehair::Codec::ResumeSolveMatrix(Codec *this,uint id,void *data)

{
  PeelRow *pPVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint16_t uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  PeelColumn *pPVar8;
  uint64_t *puVar9;
  uint16_t *puVar10;
  uint64_t *puVar11;
  uint8_t *puVar12;
  byte y;
  int iVar13;
  WirehairResult WVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  ushort uVar20;
  long lVar21;
  uint ge_column_j;
  short sVar22;
  short sVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint8_t *puVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  RowMixIterator mix;
  int local_58;
  ushort local_46 [3];
  ulong local_40;
  uint local_34;
  
  if (data == (void *)0x0) {
    return Wirehair_InvalidInput;
  }
  uVar20 = this->_row_count;
  uVar17 = (uint)uVar20;
  if ((uint)uVar20 < (uint)this->_extra_count + (uint)this->_block_count) {
    uVar29 = (ulong)this->_pivot_count;
    this->_pivot_count = this->_pivot_count + 1;
    this->_row_count = uVar20 + 1;
    uVar26 = (uVar17 - this->_block_count) + (uint)this->_dense_count + (uint)this->_defer_count;
    uVar15 = (ulong)uVar26;
    this->_ge_row_map[uVar15] = uVar20;
    this->_pivots[uVar29] = (uint16_t)uVar26;
  }
  else {
    uVar29 = 0;
    if (this->_next_pivot < this->_pivot_count) {
      uVar20 = this->_dense_count + this->_defer_count;
      uVar15 = (ulong)this->_next_pivot;
      do {
        uVar29 = uVar15 & 0xffff;
        if ((uint)this->_pivots[uVar15] < (uint)uVar20 + (uint)this->_extra_count &&
            uVar20 <= this->_pivots[uVar15]) break;
        iVar13 = (int)uVar15;
        uVar15 = uVar15 + 1;
        uVar29 = 0;
      } while (this->_pivot_count - 1 != iVar13);
    }
    if ((int)uVar29 == 0) {
      return Wirehair_ExtraInsufficient;
    }
    uVar15 = (ulong)this->_pivots[uVar29];
    uVar17 = (uint)this->_ge_row_map[uVar15];
  }
  pPVar1 = this->_peel_rows + uVar17;
  pPVar1->RecoveryId = id;
  puVar27 = this->_input_blocks + uVar17 * this->_block_bytes;
  if (this->_block_count - 1 == id) {
    memcpy(puVar27,data,(ulong)this->_output_final_bytes);
    memset(puVar27 + this->_output_final_bytes,0,
           (ulong)(this->_block_bytes - this->_output_final_bytes));
  }
  else {
    memcpy(puVar27,data,(ulong)this->_block_bytes);
  }
  puVar11 = this->_ge_matrix + this->_ge_pitch * (int)uVar15;
  local_40 = uVar15;
  memset(puVar11,0,(ulong)this->_ge_pitch << 3);
  PeelRowParameters::Initialize
            (&pPVar1->Params,id,this->_p_seed,this->_block_count,this->_mix_count);
  uVar20 = this->_block_count;
  uVar3 = this->_block_next_prime;
  uVar4 = (pPVar1->Params).PeelCount;
  uVar15 = (ulong)(pPVar1->Params).PeelFirst;
  uVar5 = (pPVar1->Params).PeelAdd;
  uVar6 = this->_mix_count;
  uVar19 = this->_mix_next_prime;
  local_46[0] = (pPVar1->Params).MixFirst;
  uVar7 = (pPVar1->Params).MixAdd;
  lVar21 = 1;
  uVar17 = (uint)local_46[0];
  do {
    uVar17 = ((uVar17 & 0xffff) + (uint)uVar7) % (uint)uVar19;
    if (uVar6 <= uVar17) {
      uVar17 = uVar19 - uVar17;
      uVar26 = uVar17 & 0xffff;
      if (uVar7 < (ushort)uVar17) {
        uVar17 = ((uint)uVar7 * 0x10000 - uVar26) % (uint)uVar7;
      }
      else {
        uVar17 = uVar7 - uVar26;
      }
    }
    local_46[lVar21] = (ushort)uVar17;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 3);
  uVar19 = this->_defer_count;
  local_34 = (uint)uVar19;
  puVar11[((ulong)(local_46[0] + local_34) & 0xffff) >> 6] =
       puVar11[((ulong)(local_46[0] + local_34) & 0xffff) >> 6] ^
       1L << ((ulong)(local_46[0] + local_34) & 0x3f);
  puVar11[(ushort)(local_46[1] + uVar19) >> 6] =
       puVar11[(ushort)(local_46[1] + uVar19) >> 6] ^
       1L << ((ulong)(ushort)(local_46[1] + uVar19) & 0x3f);
  puVar11[(ushort)(local_46[2] + uVar19) >> 6] =
       puVar11[(ushort)(local_46[2] + uVar19) >> 6] ^
       1L << ((ulong)(ushort)(local_46[2] + uVar19) & 0x3f);
  pPVar8 = this->_peel_cols;
  puVar9 = this->_compress_matrix;
  uVar17 = this->_ge_pitch;
  local_58 = (uint)uVar5 * 0x10000;
  sVar22 = uVar4 - 1;
  do {
    uVar28 = uVar15 & 0xffff;
    uVar7 = pPVar8[uVar28].field_1.Weight2Refs;
    if (pPVar8[uVar28].Mark == '\x01') {
      if ((ulong)uVar17 != 0) {
        uVar24 = 0;
        do {
          puVar11[uVar24] = puVar11[uVar24] ^ puVar9[uVar7 * uVar17 + uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar17 != uVar24);
      }
    }
    else {
      puVar11[uVar7 >> 6] = puVar11[uVar7 >> 6] ^ 1L << ((ulong)uVar7 & 0x3f);
    }
    sVar23 = sVar22;
    if (sVar22 != 0) {
      sVar23 = sVar22 + -1;
      uVar15 = (ulong)((int)uVar28 + (uint)uVar5) % (ulong)uVar3;
      if ((uint)uVar20 <= (uint)uVar15) {
        uVar26 = (uint)uVar3 - (uint)uVar15;
        uVar18 = uVar26 & 0xffff;
        if (uVar5 < (ushort)uVar26) {
          uVar15 = (ulong)(local_58 - uVar18) % (ulong)(uint)uVar5;
        }
        else {
          uVar15 = (ulong)(uVar5 - uVar18);
        }
      }
    }
    bVar30 = sVar22 != 0;
    sVar22 = sVar23;
  } while (bVar30);
  uVar17 = this->_next_pivot;
  uVar15 = (ulong)uVar17;
  uVar28 = (ulong)this->_first_heavy_column;
  if (this->_first_heavy_column != 0 && uVar15 != 0) {
    puVar10 = this->_pivots;
    puVar9 = this->_ge_matrix;
    uVar26 = this->_ge_pitch;
    uVar24 = 1;
    uVar18 = 0;
    uVar20 = 0;
    do {
      uVar18 = uVar18 >> 6;
      if ((puVar11[uVar18] & uVar24) != 0) {
        uVar28 = (ulong)(puVar10[uVar20] * uVar26);
        *(uint64_t *)((long)puVar11 + (ulong)(uVar18 * 8)) =
             puVar11[uVar18] ^ uVar24 ^
             -uVar24 & *(ulong *)((long)puVar9 + uVar28 * 8 + (ulong)(uVar18 * 8));
        uVar18 = uVar26 - uVar18;
        if (1 < uVar18) {
          uVar25 = 1;
          do {
            puVar11[(uVar20 >> 6) + uVar25] =
                 puVar11[(uVar20 >> 6) + uVar25] ^ puVar9[uVar28 + (uVar20 >> 6) + uVar25];
            uVar25 = uVar25 + 1;
          } while (uVar25 < uVar18);
        }
      }
      uVar20 = uVar20 + 1;
      uVar18 = (uint)uVar20;
      uVar28 = (ulong)this->_first_heavy_column;
    } while ((uVar18 < uVar17) &&
            (uVar24 = uVar24 >> 0x3f | uVar24 << 1, uVar18 < this->_first_heavy_column));
  }
  if (uVar17 < (uint)uVar28) {
    if ((1L << (uVar15 & 0x3f) & puVar11[uVar17 >> 6]) == 0) {
      return Wirehair_NeedMore;
    }
    puVar10 = this->_pivots;
    puVar10[uVar29] = puVar10[uVar15];
    puVar10[uVar15] = (uint16_t)local_40;
  }
  else {
    uVar19 = this->_dense_count + uVar19;
    uVar26 = ((int)local_40 - (uint)uVar19) * this->_heavy_pitch;
    puVar27 = this->_heavy_matrix;
    uVar17 = uVar6 + local_34 & 0xffff;
    if ((uint)uVar28 < uVar17) {
      do {
        puVar27[(ulong)((int)uVar28 - this->_first_heavy_column) + (ulong)uVar26] =
             (puVar11[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) != 0;
        uVar18 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar18;
      } while (uVar17 != uVar18);
    }
    uVar15 = (ulong)this->_next_pivot;
    uVar28 = (ulong)this->_first_heavy_column;
    if (this->_first_heavy_column < this->_next_pivot) {
      do {
        uVar18 = (int)uVar28 - this->_first_heavy_column;
        y = puVar27[(ulong)uVar18 + (ulong)uVar26];
        if (y != 0) {
          uVar20 = this->_pivots[uVar28];
          if (uVar20 < uVar19) {
            uVar15 = uVar28 + 1;
            if (uVar15 < uVar17) {
              uVar18 = this->_ge_pitch;
              puVar11 = this->_ge_matrix;
              uVar24 = 1L << (uVar15 & 0x3f);
              do {
                if ((puVar11[(ulong)(uVar20 * uVar18) + (uVar15 >> 6 & 0x3ffffff)] & uVar24) != 0) {
                  puVar27[(ulong)((int)uVar15 - this->_first_heavy_column) + (ulong)uVar26] =
                       puVar27[(ulong)((int)uVar15 - this->_first_heavy_column) + (ulong)uVar26] ^ y
                  ;
                }
                uVar24 = uVar24 >> 0x3f | uVar24 << 1;
                uVar16 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar16;
              } while (uVar16 < uVar17);
            }
          }
          else {
            uVar16 = ((uint)uVar20 - (uint)uVar19) * this->_heavy_pitch;
            puVar12 = this->_heavy_matrix;
            uVar2 = puVar12[(ulong)uVar18 + (ulong)uVar16];
            if (uVar2 != '\x01') {
              y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar2,y)];
              puVar27[(ulong)uVar18 + (ulong)uVar26] = y;
            }
            uVar18 = uVar18 + 1;
            gf256_muladd_mem(puVar27 + (ulong)uVar18 + (ulong)uVar26,y,
                             puVar12 + (ulong)uVar18 + (ulong)uVar16,this->_heavy_columns - uVar18);
          }
        }
        uVar28 = uVar28 + 1;
        uVar15 = (ulong)this->_next_pivot;
      } while (uVar28 < uVar15);
    }
    uVar2 = puVar27[(ulong)((uint)uVar15 - this->_first_heavy_column) + (ulong)uVar26];
    if (uVar2 == '\0') {
      WVar14 = Wirehair_NeedMore;
    }
    else {
      uVar17 = this->_first_heavy_pivot;
      puVar10 = this->_pivots;
      if ((uint)uVar15 < uVar17) {
        puVar10[uVar29] = puVar10[uVar17];
        puVar10[uVar17] = puVar10[uVar15];
        this->_first_heavy_pivot = uVar17 + 1;
      }
      else {
        puVar10[uVar29] = puVar10[uVar15];
      }
      this->_pivots[uVar15] = (uint16_t)local_40;
      WVar14 = Wirehair_ExtraInsufficient;
    }
    if (uVar2 == '\0') {
      return WVar14;
    }
  }
  uVar17 = this->_next_pivot + 1;
  this->_next_pivot = uVar17;
  if (uVar17 == this->_first_heavy_column) {
    InsertHeavyRows(this);
  }
  bVar30 = Triangle(this);
  return (uint)!bVar30;
}

Assistant:

WirehairResult Codec::ResumeSolveMatrix(
    const unsigned id, ///< Block ID
    const void * GF256_RESTRICT data ///< Block data
)
{
    CAT_IF_DUMP(cout << endl << "---- ResumeSolveMatrix ----" << endl << endl;)

    if (!data) {
        return Wirehair_InvalidInput;
    }

    unsigned row_i, ge_row_i, new_pivot_i;

    // If there is no room for it:
    if (_row_count >= _block_count + _extra_count)
    {
        const uint16_t first_heavy_row = _defer_count + _dense_count;

        new_pivot_i = 0;

        // For each pivot in the list:
        for (unsigned pivot_i = _next_pivot; pivot_i < _pivot_count; ++pivot_i)
        {
            const uint16_t ge_row_k = _pivots[pivot_i];

            // If unused row is extra:
            if (ge_row_k >= first_heavy_row &&
                ge_row_k < (first_heavy_row + _extra_count))
            {
                // Re-use it
                new_pivot_i = (uint16_t)pivot_i;
                break;
            }
        }

        // If nothing was found, return error
        if (!new_pivot_i) {
            return Wirehair_ExtraInsufficient;
        }

        // Look up row indices
        ge_row_i = _pivots[new_pivot_i];
        row_i = _ge_row_map[ge_row_i];
    }
    else
    {
        // Add extra rows to the end of the pivot list
        new_pivot_i = _pivot_count++;
        row_i = _row_count++;
        ge_row_i = _defer_count + _dense_count + row_i - _block_count;
        _ge_row_map[ge_row_i] = (uint16_t)row_i;
        _pivots[new_pivot_i] = (uint16_t)ge_row_i;

        /*
            Before the extra rows are converted to heavy, the new rows
            are added to the end of the pivot list.  And after the extra
            rows are converted to heavy rows, new rows that come in are
            also heavy and should also be at the end of the pivot list.

            So, this doesn't need to change based on what stage of the
            GE solver is running through at this point.
        */
    }

    CAT_IF_DUMP(cout << "Resuming using row slot " << row_i << " and GE row " << ge_row_i << endl;)

    // Update row data needed at this point
    PeelRow * GF256_RESTRICT row = &_peel_rows[row_i];
    row->RecoveryId = id;

    uint8_t * GF256_RESTRICT block_store_dest = _input_blocks + _block_bytes * row_i;

    // Copy new block to input blocks
    if (id != (unsigned)_block_count - 1) {
        memcpy(block_store_dest, data, _block_bytes);
    }
    else
    {
        memcpy(block_store_dest, data, _output_final_bytes);

        memset(
            block_store_dest + _output_final_bytes,
            0,
            _block_bytes - _output_final_bytes);
    }

    // Generate new GE row
    uint64_t * GF256_RESTRICT ge_new_row = _ge_matrix + _ge_pitch * ge_row_i;

    // Clear the row initially before flipping bits on
    memset(ge_new_row, 0, _ge_pitch * sizeof(uint64_t));

    row->Params.Initialize(
        id,
        _p_seed,
        _block_count,
        _mix_count);

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);
    const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

    // Generate mixing bits in GE row
    uint16_t ge_column_i = mix.Columns[0] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[1] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[2] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);

    // Generate peeled bits in GE row
    do
    {
        const uint16_t column = iter.GetColumn();

        PeelColumn * GF256_RESTRICT ref_col = &_peel_cols[column];

        // If column is peeled:
        if (ref_col->Mark == MARK_PEEL)
        {
            const unsigned row_k = ref_col->PeelRow;
            const uint64_t * GF256_RESTRICT ge_src_row = _compress_matrix + _ge_pitch * row_k;

            // Add compress row to the new GE row
            for (unsigned ii = 0; ii < _ge_pitch; ++ii) {
                ge_new_row[ii] ^= ge_src_row[ii];
            }
        }
        else
        {
            const unsigned ge_column_k = ref_col->GEColumn;

            // Set bit for this deferred column
            ge_new_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        }
    } while (iter.Iterate());

    uint64_t ge_mask = 1;

    // For each pivot-found column up to the start of the heavy columns:
    for (uint16_t pivot_j = 0; pivot_j < _next_pivot && pivot_j < _first_heavy_column; ++pivot_j)
    {
        const unsigned word_offset = pivot_j >> 6;
        uint64_t * GF256_RESTRICT rem_row = &ge_new_row[word_offset];

        // If bit is set:
        if (0 != (*rem_row & ge_mask))
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            const uint64_t * GF256_RESTRICT ge_pivot_row = _ge_matrix + word_offset + _ge_pitch * ge_row_j;
            const uint64_t row0 = (*ge_pivot_row & ~(ge_mask - 1)) ^ ge_mask;

            // Unroll first word
            *rem_row ^= row0;

            // Add previous pivot row to new row
            CAT_DEBUG_ASSERT(_ge_pitch >= word_offset);
            for (unsigned ii = 1; ii < _ge_pitch - word_offset; ++ii) {
                rem_row[ii] ^= ge_pivot_row[ii];
            }
        }

        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    // If next pivot is not heavy:
    if (_next_pivot < _first_heavy_column)
    {
        const uint64_t bit = ge_new_row[_next_pivot >> 6] & ((uint64_t)1 << (_next_pivot & 63));

        // If the next pivot was not found on this row:
        if (0 == bit) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // Swap out the pivot index for this one
        _pivots[new_pivot_i] = _pivots[_next_pivot];
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }
    else
    {
        const uint16_t column_count = _defer_count + _mix_count;
        const uint16_t first_heavy_row = _dense_count + _defer_count;
        CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
        const unsigned heavy_row_i = ge_row_i - first_heavy_row;
        CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
        uint8_t * GF256_RESTRICT heavy_row = _heavy_matrix + _heavy_pitch * heavy_row_i;

        // For each heavy column:
        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            const unsigned heavy_col_j = ge_column_j - _first_heavy_column;
            const uint8_t bit_j = static_cast<uint8_t>((ge_new_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1);

            // Copy bit into column byte
            heavy_row[heavy_col_j] = bit_j;
        }

        // For each pivot-found column in the heavy columns:
        for (unsigned pivot_j = _first_heavy_column; pivot_j < _next_pivot; ++pivot_j)
        {
            CAT_DEBUG_ASSERT(pivot_j >= _first_heavy_column);
            const unsigned heavy_col_j = pivot_j - _first_heavy_column;
            CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
            const uint8_t code_value = heavy_row[heavy_col_j];

            // If column is zero:
            if (0 == code_value) {
                continue; // Skip it
            }

            const unsigned ge_row_j = _pivots[pivot_j];

            // If previous row is heavy:
            if (ge_row_j >= first_heavy_row)
            {
                // Calculate coefficient of elimination
                CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
                const unsigned heavy_row_j = ge_row_j - first_heavy_row;
                CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
                const uint8_t * GF256_RESTRICT heavy_pivot_row = _heavy_matrix + _heavy_pitch * heavy_row_j;
                CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
                const uint8_t pivot_code = heavy_pivot_row[heavy_col_j];
                const unsigned start_column = heavy_col_j + 1;

                // heavy[m+] += exist[m+] * (code_value / pivot_code)
                if (pivot_code == 1) {
                    // heavy[m+] += exist[m+] * code_value
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        code_value,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
                else
                {
                    // eliminator = code_value / pivot_code
                    const uint8_t eliminator = gf256_div(code_value, pivot_code);

                    // Store eliminator for later
                    heavy_row[heavy_col_j] = eliminator;

                    // heavy[m+] += exist[m+] * eliminator
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        eliminator,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
            }
            else
            {
                const uint64_t * GF256_RESTRICT other_row = _ge_matrix + _ge_pitch * ge_row_j;

                unsigned ge_column_k = pivot_j + 1;
                uint64_t ge_mask_k = (uint64_t)1 << (ge_column_k & 63);

                // For each remaining column:
                for (; ge_column_k < column_count; ++ge_column_k)
                {
                    const uint64_t word = other_row[ge_column_k >> 6];
                    const bool nonzero = 0 != (word & ge_mask_k);

                    // If bit is nonzero:
                    if (nonzero) {
                        // Add in the code value for this column
                        heavy_row[ge_column_k - _first_heavy_column] ^= code_value;
                    }

                    ge_mask_k = CAT_ROL64(ge_mask_k, 1);
                }
            } // end if row is heavy
        } // next column

        CAT_DEBUG_ASSERT(_next_pivot >= _first_heavy_column);
        const unsigned next_heavy_col = _next_pivot - _first_heavy_column;

        // If the next pivot was not found on this heavy row:
        if (!heavy_row[next_heavy_col]) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // If a non-heavy pivot just got moved into heavy pivot list:
        if (_next_pivot < _first_heavy_pivot)
        {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_first_heavy_pivot];
            _pivots[_first_heavy_pivot] = _pivots[_next_pivot];

            // And move the first heavy pivot up one to cover the hole
            ++_first_heavy_pivot;
        }
        else {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_next_pivot];
        }

        CAT_DEBUG_ASSERT(ge_row_i < _pivot_count);
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }

    // NOTE: Pivot was found and is definitely not set anywhere else
    // so it doesn't need to be cleared from any other GE rows.

    // If just starting heavy columns:
    if (++_next_pivot == _first_heavy_column) {
        InsertHeavyRows();
    }

    // Resume Triangle() at next pivot to determine
    return Triangle() ? Wirehair_Success : Wirehair_NeedMore;
}